

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O1

string * __thiscall
t_st_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_type *ttype)

{
  t_program *ptVar1;
  pointer pcVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string name;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  char *local_90;
  undefined8 local_88;
  char local_80 [8];
  undefined8 uStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50;
  undefined8 local_48;
  char local_40 [8];
  undefined8 uStack_38;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  ptVar1 = ttype->program_;
  if ((ptVar1 != (t_program *)0x0) &&
     (ptVar1 != (this->super_t_oop_generator).super_t_generator.program_)) {
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0x11])(ttype);
    if ((char)iVar5 == '\0') {
      pcVar2 = (ptVar1->name_)._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,pcVar2 + (ptVar1->name_)._M_string_length);
      std::__cxx11::string::append((char *)&local_b0);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
    }
  }
  iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  lVar3 = *(long *)CONCAT44(extraout_var,iVar5);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,lVar3,((long *)CONCAT44(extraout_var,iVar5))[1] + lVar3);
  iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
    if ((char)iVar5 == '\0') goto LAB_003496cd;
  }
  iVar5 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  lVar3 = *(long *)CONCAT44(extraout_var_00,iVar5);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,lVar3,((long *)CONCAT44(extraout_var_00,iVar5))[1] + lVar3);
  pcVar4 = local_90;
  iVar5 = toupper((int)*local_90);
  *pcVar4 = (char)iVar5;
  if (local_90 == local_80) {
    uStack_38 = uStack_78;
    local_50 = local_40;
  }
  else {
    local_50 = local_90;
  }
  local_48 = local_88;
  local_88 = 0;
  local_80[0] = '\0';
  local_90 = local_80;
  std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
LAB_003496cd:
  std::operator+(__return_storage_ptr__,&local_70,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::type_name(t_type* ttype) {
  string prefix = "";
  t_program* program = ttype->get_program();
  if (program != nullptr && program != program_) {
    if (!ttype->is_service()) {
      prefix = program->get_name() + "_types.";
    }
  }

  string name = ttype->get_name();
  if (ttype->is_struct() || ttype->is_xception()) {
    name = capitalize(ttype->get_name());
  }

  return prefix + name;
}